

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O2

void __thiscall QCollator::QCollator(QCollator *this,QLocale *locale)

{
  QCollatorPrivate *this_00;
  
  this_00 = (QCollatorPrivate *)operator_new(0x20);
  QCollatorPrivate::QCollatorPrivate(this_00,locale);
  this->d = this_00;
  return;
}

Assistant:

QCollator::QCollator(const QLocale &locale)
    : d(new QCollatorPrivate(locale))
{
}